

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::scroll_event(Application *this,float offset_x,float offset_y)

{
  int iVar1;
  long in_RDI;
  float in_XMM1_Da;
  Application *in_stack_00000050;
  
  update_style(in_stack_00000050);
  iVar1 = *(int *)(in_RDI + 0x18);
  if ((iVar1 == 0) || ((iVar1 != 1 && (iVar1 == 2)))) {
    CGL::Camera::move_forward((double)-in_XMM1_Da * *(double *)(in_RDI + 0x2c8));
  }
  return;
}

Assistant:

void Application::scroll_event(float offset_x, float offset_y) {

  update_style();

  switch(mode) {
    case EDIT_MODE:
    case VISUALIZE_MODE:
      camera.move_forward(-offset_y * scroll_rate);
      break;
    case RENDER_MODE:
      break;
  }
}